

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.c
# Opt level: O2

int wally_tx_remove_input(wally_tx *tx,size_t index)

{
  _Bool _Var1;
  size_t sVar2;
  int iVar3;
  wally_tx_input *input;
  
  _Var1 = is_valid_tx(tx);
  iVar3 = -2;
  if ((_Var1) && (index < tx->num_inputs)) {
    input = tx->inputs + index;
    iVar3 = 0;
    tx_input_free(input,false);
    sVar2 = tx->num_inputs;
    if (sVar2 - 1 != index) {
      memmove(input,input + 1,(sVar2 + ~index) * 0xd0);
      sVar2 = tx->num_inputs;
    }
    wally_clear(tx->inputs + (sVar2 - 1),0xd0);
    tx->num_inputs = tx->num_inputs - 1;
  }
  return iVar3;
}

Assistant:

int wally_tx_remove_input(struct wally_tx *tx, size_t index)
{
    struct wally_tx_input *input;

    if (!is_valid_tx(tx) || index >= tx->num_inputs)
        return WALLY_EINVAL;

    input = tx->inputs + index;
    tx_input_free(input, false);
    if (index != tx->num_inputs - 1)
        memmove(input, input + 1,
                (tx->num_inputs - index - 1) * sizeof(*input));
    wally_clear(tx->inputs + tx->num_inputs - 1, sizeof(*input));

    tx->num_inputs -= 1;
    return WALLY_OK;
}